

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void updateVirtualTable(Parse *pParse,SrcList *pSrc,Table *pTab,ExprList *pChanges,Expr *pRowid,
                       int *aXRef,Expr *pWhere,int onError)

{
  short sVar1;
  short sVar2;
  int p1;
  int iVar3;
  sqlite3 *db;
  Vdbe *p;
  int p2;
  bool bVar4;
  int addr;
  int p3;
  int iVar5;
  WhereInfo *pWInfo;
  Expr *pEVar6;
  Index *pIVar7;
  ExprList *pList;
  Parse *pPVar8;
  Parse *pPVar9;
  int p2_00;
  Op *pOVar10;
  int iVar11;
  VTable *zP4;
  int p2_01;
  long lVar12;
  ExprList *in_stack_ffffffffffffff38;
  
  db = pParse->db;
  p = pParse->pVdbe;
  for (zP4 = (pTab->u).vtab.p; (zP4 != (VTable *)0x0 && (zP4->db != db)); zP4 = zP4->pNext) {
  }
  sVar1 = pTab->nCol;
  p2_00 = sVar1 + 2;
  iVar11 = pSrc->a[0].iCursor;
  p1 = pParse->nTab;
  pParse->nTab = p1 + 1;
  pPVar9 = pParse;
  addr = sqlite3VdbeAddOp3(p,0x76,p1,p2_00,0);
  iVar3 = pParse->nMem;
  p3 = iVar3 + 1;
  iVar5 = iVar3 + sVar1;
  pParse->nMem = iVar5 + 2;
  if (pSrc->nSrc < 2) {
    p2_01 = iVar5 + 4;
    pParse->nMem = p2_01;
    pWInfo = sqlite3WhereBegin(pParse,pSrc,pWhere,(ExprList *)0x0,(ExprList *)0x0,(Select *)0x0,4,0)
    ;
    if (pWInfo == (WhereInfo *)0x0) {
      return;
    }
    if (0 < pTab->nCol) {
      lVar12 = 0;
      do {
        p2 = (int)lVar12;
        if ((long)aXRef[lVar12] < 0) {
          pParse = pPVar9;
          sqlite3VdbeAddOp3(p,0xaf,iVar11,p2,iVar3 + 3 + p2);
          pPVar9 = pParse;
          if (0 < (long)p->nOp) {
            p->aOp[(long)p->nOp + -1].p5 = 1;
          }
        }
        else {
          sqlite3ExprCode(pParse,pChanges->a[aXRef[lVar12]].pExpr,iVar3 + 3 + p2);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < pTab->nCol);
    }
    if ((pTab->tabFlags & 0x80) == 0) {
      sqlite3VdbeAddOp3(p,0x87,iVar11,p3,0);
      if (pRowid == (Expr *)0x0) {
        sqlite3VdbeAddOp3(p,0x87,iVar11,iVar3 + 2,0);
      }
      else {
        sqlite3ExprCode(pParse,pRowid,iVar3 + 2);
      }
    }
    else {
      for (pIVar7 = pTab->pIndex;
          (pIVar7 != (Index *)0x0 && ((*(ushort *)&pIVar7->field_0x63 & 3) != 2));
          pIVar7 = pIVar7->pNext) {
      }
      sVar2 = *pIVar7->aiColumn;
      sqlite3VdbeAddOp3(p,0xaf,iVar11,(int)sVar2,p3);
      sqlite3VdbeAddOp3(p,0x51,iVar3 + sVar2 + 3,iVar3 + 2,0);
    }
    if (pWInfo->eOnePass == '\0') {
      pPVar8 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar8 = pParse;
      }
      pPVar8->isMultiWrite = '\x01';
      sqlite3VdbeAddOp3(p,0x61,p3,p2_00,iVar5 + 3);
      sqlite3VdbeAddOp3(p,0x7f,p1,p2_01,0);
      sqlite3VdbeAddOp3(p,0x80,p1,iVar5 + 3,p2_01);
      bVar4 = true;
    }
    else {
      sqlite3VdbeChangeToNoop(p,addr);
      sqlite3VdbeAddOp3(p,0x7a,iVar11,0,0);
      bVar4 = false;
    }
    goto LAB_001914f9;
  }
  if ((pTab->tabFlags & 0x80) == 0) {
    if (pRowid == (Expr *)0x0) {
      pIVar7 = (Index *)0x0;
      pEVar6 = sqlite3PExpr(pPVar9,0x4b,(Expr *)0x0,(Expr *)0x0);
      pParse = pPVar9;
    }
    else {
      pIVar7 = (Index *)0x0;
LAB_0019127f:
      pEVar6 = exprDup(db,pRowid,0,(u8 **)0x0);
      pParse = pPVar9;
    }
  }
  else {
    for (pIVar7 = pTab->pIndex;
        (pIVar7 != (Index *)0x0 && ((*(ushort *)&pIVar7->field_0x63 & 3) != 2));
        pIVar7 = pIVar7->pNext) {
    }
    sVar2 = *pIVar7->aiColumn;
    if ((long)aXRef[sVar2] < 0) {
      pEVar6 = sqlite3PExpr(pPVar9,0x4b,(Expr *)0x0,(Expr *)0x0);
      pParse = pPVar9;
      if (pEVar6 != (Expr *)0x0) {
        pEVar6->iColumn = sVar2 + 1;
      }
    }
    else {
      pRowid = pChanges->a[aXRef[sVar2]].pExpr;
      if (pRowid != (Expr *)0x0) goto LAB_0019127f;
      pEVar6 = (Expr *)0x0;
      pParse = pPVar9;
    }
  }
  pList = sqlite3ExprListAppendNew(pParse->db,pEVar6);
  if (0 < pTab->nCol) {
    lVar12 = 0;
    do {
      if ((long)aXRef[lVar12] < 0) {
        pEVar6 = sqlite3PExpr(pParse,0x4b,(Expr *)0x0,(Expr *)0x0);
        if (pEVar6 != (Expr *)0x0) {
          pEVar6->iColumn = (short)lVar12 + 1;
        }
      }
      else {
        pEVar6 = pChanges->a[aXRef[lVar12]].pExpr;
        if (pEVar6 == (Expr *)0x0) {
          pEVar6 = (Expr *)0x0;
        }
        else {
          pEVar6 = exprDup(db,pEVar6,0,(u8 **)0x0);
        }
      }
      pList = sqlite3ExprListAppend(pParse,pList,pEVar6);
      lVar12 = lVar12 + 1;
    } while (lVar12 < pTab->nCol);
  }
  updateFromSelect(pParse,p1,pIVar7,pList,pSrc,pWhere,in_stack_ffffffffffffff38,(Expr *)pParse);
  if (pList != (ExprList *)0x0) {
    exprListDeleteNN(db,pList);
  }
  bVar4 = true;
  pWInfo = (WhereInfo *)0x0;
  pPVar9 = pParse;
LAB_001914f9:
  if (bVar4) {
    pParse = pPVar9;
    if (pSrc->nSrc == 1) {
      sqlite3WhereEnd(pWInfo);
      pParse = pPVar9;
    }
    iVar11 = 0;
    addr = sqlite3VdbeAddOp3(p,0x23,p1,0,0);
    if (-2 < sVar1) {
      do {
        sqlite3VdbeAddOp3(p,0x5e,p1,iVar11,iVar11 + p3);
        iVar11 = iVar11 + 1;
      } while (p2_00 != iVar11);
    }
  }
  sqlite3VtabMakeWritable(pParse,pTab);
  iVar11 = sqlite3VdbeAddOp3(p,7,0,p2_00,p3);
  sqlite3VdbeChangeP4(p,iVar11,(char *)zP4,-0xb);
  if (0 < (long)p->nOp) {
    iVar11 = 2;
    if (onError != 0xb) {
      iVar11 = onError;
    }
    p->aOp[(long)p->nOp + -1].p5 = (u16)iVar11;
  }
  pPVar9 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar9 = pParse;
  }
  pPVar9->mayAbort = '\x01';
  if (bVar4) {
    sqlite3VdbeAddOp3(p,0x26,p1,addr + 1,0);
    if (p->db->mallocFailed == '\0') {
      iVar11 = p->nOp + -1;
      if (-1 < addr) {
        iVar11 = addr;
      }
      pOVar10 = p->aOp + iVar11;
    }
    else {
      pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar10->p2 = p->nOp;
    sqlite3VdbeAddOp3(p,0x7a,p1,0,0);
    return;
  }
  sqlite3WhereEnd(pWInfo);
  return;
}

Assistant:

static void updateVirtualTable(
  Parse *pParse,       /* The parsing context */
  SrcList *pSrc,       /* The virtual table to be modified */
  Table *pTab,         /* The virtual table */
  ExprList *pChanges,  /* The columns to change in the UPDATE statement */
  Expr *pRowid,        /* Expression used to recompute the rowid */
  int *aXRef,          /* Mapping from columns of pTab to entries in pChanges */
  Expr *pWhere,        /* WHERE clause of the UPDATE statement */
  int onError          /* ON CONFLICT strategy */
){
  Vdbe *v = pParse->pVdbe;  /* Virtual machine under construction */
  int ephemTab;             /* Table holding the result of the SELECT */
  int i;                    /* Loop counter */
  sqlite3 *db = pParse->db; /* Database connection */
  const char *pVTab = (const char*)sqlite3GetVTable(db, pTab);
  WhereInfo *pWInfo = 0;
  int nArg = 2 + pTab->nCol;      /* Number of arguments to VUpdate */
  int regArg;                     /* First register in VUpdate arg array */
  int regRec;                     /* Register in which to assemble record */
  int regRowid;                   /* Register for ephem table rowid */
  int iCsr = pSrc->a[0].iCursor;  /* Cursor used for virtual table scan */
  int aDummy[2];                  /* Unused arg for sqlite3WhereOkOnePass() */
  int eOnePass;                   /* True to use onepass strategy */
  int addr;                       /* Address of OP_OpenEphemeral */

  /* Allocate nArg registers in which to gather the arguments for VUpdate. Then
  ** create and open the ephemeral table in which the records created from
  ** these arguments will be temporarily stored. */
  assert( v );
  ephemTab = pParse->nTab++;
  addr= sqlite3VdbeAddOp2(v, OP_OpenEphemeral, ephemTab, nArg);
  regArg = pParse->nMem + 1;
  pParse->nMem += nArg;
  if( pSrc->nSrc>1 ){
    Index *pPk = 0;
    Expr *pRow;
    ExprList *pList;
    if( HasRowid(pTab) ){
      if( pRowid ){
        pRow = sqlite3ExprDup(db, pRowid, 0);
      }else{
        pRow = sqlite3PExpr(pParse, TK_ROW, 0, 0);
      }
    }else{
      i16 iPk;      /* PRIMARY KEY column */
      pPk = sqlite3PrimaryKeyIndex(pTab);
      assert( pPk!=0 );
      assert( pPk->nKeyCol==1 );
      iPk = pPk->aiColumn[0];
      if( aXRef[iPk]>=0 ){
        pRow = sqlite3ExprDup(db, pChanges->a[aXRef[iPk]].pExpr, 0);
      }else{
        pRow = exprRowColumn(pParse, iPk);
      }
    }
    pList = sqlite3ExprListAppend(pParse, 0, pRow);

    for(i=0; i<pTab->nCol; i++){
      if( aXRef[i]>=0 ){
        pList = sqlite3ExprListAppend(pParse, pList,
          sqlite3ExprDup(db, pChanges->a[aXRef[i]].pExpr, 0)
        );
      }else{
        pList = sqlite3ExprListAppend(pParse, pList, exprRowColumn(pParse, i));
      }
    }

    updateFromSelect(pParse, ephemTab, pPk, pList, pSrc, pWhere, 0, 0);
    sqlite3ExprListDelete(db, pList);
    eOnePass = ONEPASS_OFF;
  }else{
    regRec = ++pParse->nMem;
    regRowid = ++pParse->nMem;

    /* Start scanning the virtual table */
    pWInfo = sqlite3WhereBegin(
        pParse, pSrc, pWhere, 0, 0, 0, WHERE_ONEPASS_DESIRED, 0
    );
    if( pWInfo==0 ) return;

    /* Populate the argument registers. */
    for(i=0; i<pTab->nCol; i++){
      assert( (pTab->aCol[i].colFlags & COLFLAG_GENERATED)==0 );
      if( aXRef[i]>=0 ){
        sqlite3ExprCode(pParse, pChanges->a[aXRef[i]].pExpr, regArg+2+i);
      }else{
        sqlite3VdbeAddOp3(v, OP_VColumn, iCsr, i, regArg+2+i);
        sqlite3VdbeChangeP5(v, OPFLAG_NOCHNG);/* For sqlite3_vtab_nochange() */
      }
    }
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp2(v, OP_Rowid, iCsr, regArg);
      if( pRowid ){
        sqlite3ExprCode(pParse, pRowid, regArg+1);
      }else{
        sqlite3VdbeAddOp2(v, OP_Rowid, iCsr, regArg+1);
      }
    }else{
      Index *pPk;   /* PRIMARY KEY index */
      i16 iPk;      /* PRIMARY KEY column */
      pPk = sqlite3PrimaryKeyIndex(pTab);
      assert( pPk!=0 );
      assert( pPk->nKeyCol==1 );
      iPk = pPk->aiColumn[0];
      sqlite3VdbeAddOp3(v, OP_VColumn, iCsr, iPk, regArg);
      sqlite3VdbeAddOp2(v, OP_SCopy, regArg+2+iPk, regArg+1);
    }

    eOnePass = sqlite3WhereOkOnePass(pWInfo, aDummy);

    /* There is no ONEPASS_MULTI on virtual tables */
    assert( eOnePass==ONEPASS_OFF || eOnePass==ONEPASS_SINGLE );

    if( eOnePass ){
      /* If using the onepass strategy, no-op out the OP_OpenEphemeral coded
      ** above. */
      sqlite3VdbeChangeToNoop(v, addr);
      sqlite3VdbeAddOp1(v, OP_Close, iCsr);
    }else{
      /* Create a record from the argument register contents and insert it into
      ** the ephemeral table. */
      sqlite3MultiWrite(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regArg, nArg, regRec);
#if defined(SQLITE_DEBUG) && !defined(SQLITE_ENABLE_NULL_TRIM)
      /* Signal an assert() within OP_MakeRecord that it is allowed to
      ** accept no-change records with serial_type 10 */
      sqlite3VdbeChangeP5(v, OPFLAG_NOCHNG_MAGIC);
#endif
      sqlite3VdbeAddOp2(v, OP_NewRowid, ephemTab, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, ephemTab, regRec, regRowid);
    }
  }


  if( eOnePass==ONEPASS_OFF ){
    /* End the virtual table scan */
    if( pSrc->nSrc==1 ){
      sqlite3WhereEnd(pWInfo);
    }

    /* Begin scannning through the ephemeral table. */
    addr = sqlite3VdbeAddOp1(v, OP_Rewind, ephemTab); VdbeCoverage(v);

    /* Extract arguments from the current row of the ephemeral table and
    ** invoke the VUpdate method.  */
    for(i=0; i<nArg; i++){
      sqlite3VdbeAddOp3(v, OP_Column, ephemTab, i, regArg+i);
    }
  }
  sqlite3VtabMakeWritable(pParse, pTab);
  sqlite3VdbeAddOp4(v, OP_VUpdate, 0, nArg, regArg, pVTab, P4_VTAB);
  sqlite3VdbeChangeP5(v, onError==OE_Default ? OE_Abort : onError);
  sqlite3MayAbort(pParse);

  /* End of the ephemeral table scan. Or, if using the onepass strategy,
  ** jump to here if the scan visited zero rows. */
  if( eOnePass==ONEPASS_OFF ){
    sqlite3VdbeAddOp2(v, OP_Next, ephemTab, addr+1); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr);
    sqlite3VdbeAddOp2(v, OP_Close, ephemTab, 0);
  }else{
    sqlite3WhereEnd(pWInfo);
  }
}